

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O1

shared_ptr<const_BayesianGameWithClusterInfo> __thiscall
boost::
dynamic_pointer_cast<BayesianGameWithClusterInfo_const,BayesianGameIdenticalPayoffInterface_const>
          (boost *this,shared_ptr<const_BayesianGameIdenticalPayoffInterface> *r)

{
  sp_counted_base *psVar1;
  long lVar2;
  shared_count in_RDX;
  undefined1 auVar3 [16];
  shared_ptr<const_BayesianGameWithClusterInfo> sVar4;
  
  if (r->px == (element_type *)0x0) {
    lVar2 = 0;
  }
  else {
    auVar3 = __dynamic_cast(r->px,&BayesianGameIdenticalPayoffInterface::typeinfo,
                            &BayesianGameWithClusterInfo::typeinfo,0x20);
    in_RDX.pi_ = auVar3._8_8_;
    lVar2 = auVar3._0_8_;
  }
  if (lVar2 == 0) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    *(long *)this = lVar2;
    psVar1 = (r->pn).pi_;
    *(sp_counted_base **)(this + 8) = psVar1;
    if (psVar1 != (sp_counted_base *)0x0) {
      LOCK();
      psVar1->use_count_ = psVar1->use_count_ + 1;
      UNLOCK();
    }
  }
  sVar4.pn.pi_ = in_RDX.pi_;
  sVar4.px = (element_type *)this;
  return sVar4;
}

Assistant:

shared_ptr<T> dynamic_pointer_cast( shared_ptr<U> const & r ) BOOST_NOEXCEPT
{
    (void) dynamic_cast< T* >( static_cast< U* >( 0 ) );

    typedef typename shared_ptr<T>::element_type E;

    E * p = dynamic_cast< E* >( r.get() );
    return p? shared_ptr<T>( r, p ): shared_ptr<T>();
}